

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O1

bool __thiscall
double_conversion::FastDtoa
          (double_conversion *this,double v,FastDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  char cVar1;
  bool bVar2;
  FastDtoaMode FVar3;
  FastDtoaMode FVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  undefined4 in_register_00000014;
  ulong uVar12;
  ulong uVar13;
  uint64_t uVar14;
  ulong uVar15;
  uint uVar16;
  int *unit;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  DiyFp DVar26;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  DiyFp ten_mk;
  DiyFp boundary_plus;
  DiyFp boundary_minus;
  int *in_stack_ffffffffffffff58;
  DiyFp local_90;
  long local_80;
  uint local_78;
  int local_74;
  DiyFp local_70;
  ulong local_60;
  long local_58;
  DiyFp local_50;
  int *local_40;
  uint64_t local_38;
  
  local_80 = CONCAT44(in_register_00000014,requested_digits);
  unit = buffer._8_8_;
  uVar16 = (uint)this;
  local_40 = length;
  local_50.f_ = (uint64_t)v;
  if (uVar16 < 2) {
    DVar26 = Double::AsNormalizedDiyFp((Double *)&local_50);
    iVar9 = DVar26.e_;
    local_50.f_ = 0;
    local_50.e_ = 0;
    local_70.f_ = 0;
    local_70.e_ = 0;
    if (uVar16 == 0) {
      local_90.f_ = (uint64_t)v;
      Double::NormalizedBoundaries((Double *)&local_90,&local_50,&local_70);
    }
    else {
      local_90.f_ = CONCAT44(local_90.f_._4_4_,(float)v);
      Single::NormalizedBoundaries((Single *)&local_90,&local_50,&local_70);
    }
    local_90.f_ = 0;
    local_90.e_ = 0;
    PowersOfTenCache::GetCachedPowerForBinaryExponentRange
              (-0x7c - iVar9,-0x60 - iVar9,&local_90,&local_74);
    uVar5 = DVar26.f_ >> 0x20;
    uVar10 = DVar26.f_ & 0xffffffff;
    uVar22 = local_90.f_ & 0xffffffff;
    uVar17 = local_90.f_ >> 0x20;
    uVar15 = uVar17 * uVar10;
    uVar6 = uVar5 * uVar22;
    iVar9 = local_90.e_ + iVar9;
    uVar13 = (local_50.f_ & 0xffffffff) * uVar17;
    uVar24 = (local_50.f_ >> 0x20) * uVar22;
    uVar18 = uVar17 * (local_70.f_ & 0xffffffff);
    uVar25 = (local_70.f_ >> 0x20) * uVar22;
    lVar19 = (uVar18 >> 0x20) + (uVar25 >> 0x20) + (local_70.f_ >> 0x20) * uVar17;
    uVar25 = (uVar18 & 0xffffffff) +
             (uVar25 & 0xffffffff) + ((local_70.f_ & 0xffffffff) * uVar22 >> 0x20) + 0x80000000 >>
             0x20;
    uVar23 = uVar25 + lVar19 + 1;
    uVar12 = (ulong)(-iVar9 - 0x40);
    local_38 = 1L << (-(char)iVar9 & 0x3fU);
    uVar18 = uVar23 >> (-(char)iVar9 & 0x3fU);
    uVar25 = ((lVar19 + uVar25) -
             (((uVar13 & 0xffffffff) +
               (uVar24 & 0xffffffff) + ((local_50.f_ & 0xffffffff) * uVar22 >> 0x20) + 0x80000000 >>
              0x20) + (uVar13 >> 0x20) + (uVar24 >> 0x20) + (local_50.f_ >> 0x20) * uVar17)) + 2;
    uVar13 = local_38 - 1;
    uVar24 = uVar23 & uVar13;
    uVar16 = iVar9 * 0x4d1 + 0x26d51 >> 0xc;
    if (*(uint *)(kSmallPowersOfTen + (long)(int)uVar16 * 4 + 4) <= (uint)uVar18) {
      uVar16 = uVar16 + 1;
    }
    uVar20 = (ulong)(int)uVar16;
    uVar21 = *(uint *)(kSmallPowersOfTen + uVar20 * 4);
    *unit = 0;
    local_58 = uVar23 - ((uVar6 >> 0x20) + uVar17 * uVar5 + (uVar15 >> 0x20) +
                        ((uVar15 & 0xffffffff) + (uVar6 & 0xffffffff) + (uVar10 * uVar22 >> 0x20) +
                         0x80000000 >> 0x20));
    local_78 = (int)uVar16 >> 0x1f & uVar16;
    local_60 = uVar12;
    while (lVar19 = local_80, 0 < (int)uVar16) {
      uVar5 = uVar18 & 0xffffffff;
      uVar18 = uVar5 % (ulong)uVar21;
      *(char *)(local_80 + *unit) = (char)(uVar5 / uVar21) + '0';
      buffer_00.length_ = *unit + 1;
      *unit = buffer_00.length_;
      uVar5 = (uVar18 << ((byte)uVar12 & 0x3f)) + uVar24;
      if (uVar5 < uVar25) {
        buffer_00.start_ = (char *)local_80;
        buffer_00._12_4_ = 0;
        bVar2 = RoundWeed(buffer_00,(int)local_58,uVar25,uVar5,
                          (ulong)uVar21 << ((byte)uVar12 & 0x3f),1,(uint64_t)unit);
        uVar20 = (ulong)bVar2;
        uVar12 = local_60;
      }
      else {
        uVar21 = uVar21 / 10;
      }
      uVar16 = uVar16 - 1;
      lVar19 = local_80;
      if (uVar5 < uVar25) goto LAB_00879951;
    }
    uVar14 = 1;
    uVar16 = local_78;
    do {
      uVar14 = uVar14 * 10;
      uVar25 = uVar25 * 10;
      *(char *)(lVar19 + *unit) = (char)(uVar24 * 10 >> ((byte)uVar12 & 0x3f)) + '0';
      buffer_01.length_ = *unit + 1;
      *unit = buffer_01.length_;
      uVar24 = uVar24 * 10 & uVar13;
      if (uVar24 < uVar25) {
        buffer_01.start_ = (char *)lVar19;
        buffer_01._12_4_ = 0;
        bVar2 = RoundWeed(buffer_01,(int)uVar14 * (int)local_58,uVar25,uVar24,local_38,uVar14,
                          (uint64_t)unit);
        uVar20 = (ulong)bVar2;
        uVar12 = local_60;
      }
      uVar16 = uVar16 - 1;
    } while (uVar25 <= uVar24);
LAB_00879951:
    local_74 = uVar16 - local_74;
    goto LAB_00879a1d;
  }
  if (uVar16 != 2) {
    abort();
  }
  DVar26 = Double::AsNormalizedDiyFp((Double *)&local_50);
  iVar9 = DVar26.e_;
  local_50.f_ = 0;
  local_50.e_ = 0;
  PowersOfTenCache::GetCachedPowerForBinaryExponentRange
            (-0x7c - iVar9,-0x60 - iVar9,&local_50,(int *)&local_70);
  lVar19 = local_80;
  uVar18 = DVar26.f_ >> 0x20;
  uVar12 = DVar26.f_ & 0xffffffff;
  uVar13 = (local_50.f_ >> 0x20) * uVar12;
  uVar25 = uVar18 * (local_50.f_ & 0xffffffff);
  cVar1 = (char)(iVar9 + local_50.e_);
  bVar7 = -cVar1 - 0x40;
  bVar8 = -cVar1;
  uVar14 = 1L << (bVar8 & 0x3f);
  uVar18 = ((uVar13 & 0xffffffff) +
            (uVar25 & 0xffffffff) + ((local_50.f_ & 0xffffffff) * uVar12 >> 0x20) + 0x80000000 >>
           0x20) + (uVar13 >> 0x20) + (uVar25 >> 0x20) + (local_50.f_ >> 0x20) * uVar18;
  uVar13 = uVar18 >> (bVar8 & 0x3f);
  uVar18 = uVar18 & uVar14 - 1;
  iVar9 = (iVar9 + local_50.e_) * 0x4d1 + 0x26d51 >> 0xc;
  if (*(uint *)(kSmallPowersOfTen + (long)iVar9 * 4 + 4) <= (uint)uVar13) {
    iVar9 = iVar9 + 1;
  }
  uVar16 = *(uint *)(kSmallPowersOfTen + (long)iVar9 * 4);
  *unit = 0;
  do {
    iVar11 = (int)uVar13;
    if (iVar9 < 1) {
      uVar25 = (ulong)uVar16;
      FVar3 = mode;
      break;
    }
    uVar25 = uVar13 & 0xffffffff;
    uVar13 = uVar25 % (ulong)uVar16;
    iVar11 = (int)uVar13;
    *(char *)(local_80 + *unit) = (char)(uVar25 / uVar16) + '0';
    *unit = *unit + 1;
    FVar3 = FAST_DTOA_SHORTEST;
    iVar9 = iVar9 + -1;
    uVar25 = (ulong)uVar16 / 10;
    if (mode == FAST_DTOA_SHORTEST_SINGLE) {
      uVar25 = (ulong)uVar16;
    }
    uVar16 = (uint)uVar25;
    mode = mode - FAST_DTOA_SHORTEST_SINGLE;
  } while (mode != FAST_DTOA_SHORTEST);
  local_90.f_ = CONCAT44(local_90.f_._4_4_,iVar9);
  if (FVar3 == FAST_DTOA_SHORTEST) {
    iVar11 = (iVar11 << (bVar7 & 0x3f)) + (int)uVar18;
    iVar9 = *unit;
    uVar14 = uVar25 << (bVar7 & 0x3f);
    uVar13 = 1;
  }
  else {
    bVar2 = false;
    uVar13 = 1;
    if ((0 < (int)FVar3) && (1 < uVar18)) {
      do {
        uVar13 = uVar13 * 10;
        *(char *)(local_80 + *unit) = (char)(uVar18 * 10 >> (bVar7 & 0x3f)) + '0';
        *unit = *unit + 1;
        FVar4 = FVar3 - FAST_DTOA_SHORTEST_SINGLE;
        uVar18 = uVar18 * 10 & uVar14 - 1;
        iVar9 = iVar9 + -1;
        if ((int)FVar3 < 2) break;
        FVar3 = FVar4;
      } while (uVar13 < uVar18);
      local_90.f_ = CONCAT44(local_90.f_._4_4_,iVar9);
      bVar2 = FVar4 == FAST_DTOA_SHORTEST;
    }
    if (!bVar2) {
      uVar20 = 0;
      goto LAB_00879a13;
    }
    iVar9 = *unit;
    iVar11 = (int)uVar18;
  }
  buffer_02.length_ = iVar9;
  buffer_02.start_ = (char *)local_80;
  buffer_02._12_4_ = 0;
  bVar2 = RoundWeedCounted(buffer_02,iVar11,uVar14,uVar13,(uint64_t)&local_90,
                           in_stack_ffffffffffffff58);
  uVar20 = (ulong)bVar2;
LAB_00879a13:
  local_74 = (int)local_90.f_ - (int)local_70.f_;
LAB_00879a1d:
  if ((uVar20 & 1) != 0) {
    *local_40 = local_74 + *unit;
    *(undefined1 *)(lVar19 + *unit) = 0;
  }
  return (bool)((byte)uVar20 & 1);
}

Assistant:

bool FastDtoa(double v,
              FastDtoaMode mode,
              int requested_digits,
              Vector<char> buffer,
              int* length,
              int* decimal_point) {
  DOUBLE_CONVERSION_ASSERT(v > 0);
  DOUBLE_CONVERSION_ASSERT(!Double(v).IsSpecial());

  bool result = false;
  int decimal_exponent = 0;
  switch (mode) {
    case FAST_DTOA_SHORTEST:
    case FAST_DTOA_SHORTEST_SINGLE:
      result = Grisu3(v, mode, buffer, length, &decimal_exponent);
      break;
    case FAST_DTOA_PRECISION:
      result = Grisu3Counted(v, requested_digits,
                             buffer, length, &decimal_exponent);
      break;
    default:
      DOUBLE_CONVERSION_UNREACHABLE();
  }
  if (result) {
    *decimal_point = *length + decimal_exponent;
    buffer[*length] = '\0';
  }
  return result;
}